

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O1

bool __thiscall dg::pta::PointerAnalysisFS::afterProcessed(PointerAnalysisFS *this,PSNode *n)

{
  MemoryMapT *mm;
  long *plVar1;
  bool bVar2;
  bool bVar3;
  long *plVar4;
  PointsToSetT *overwritten;
  
  mm = *(MemoryMapT **)(n + 0x10);
  if ((*(int *)(n + 0x90) != 3) ||
     (bVar2 = pointsToAllocationInLoop(*(PSNode **)(*(long *)(n + 0x58) + 8)), bVar2)) {
    overwritten = (PointsToSetT *)0x0;
  }
  else {
    overwritten = (PointsToSetT *)(*(long *)(*(long *)(n + 0x58) + 8) + 0xb0);
  }
  if ((ulong)(*(long *)(n + 0x48) - *(long *)(n + 0x40)) < 9 &&
      *(long *)(n + 0x48) != *(long *)(n + 0x40)) {
    if (0x14 < *(uint *)(n + 0x90)) {
      return false;
    }
    if ((0x100608U >> (*(uint *)(n + 0x90) & 0x1f) & 1) == 0) {
      return false;
    }
  }
  plVar1 = *(long **)(n + 0x48);
  bVar2 = false;
  for (plVar4 = *(long **)(n + 0x40); plVar4 != plVar1; plVar4 = plVar4 + 1) {
    if (*(MemoryMapT **)(*plVar4 + 0x10) != (MemoryMapT *)0x0) {
      bVar3 = mergeMaps(mm,*(MemoryMapT **)(*plVar4 + 0x10),overwritten);
      bVar2 = (bool)(bVar2 | bVar3);
    }
  }
  if ((n != (PSNode *)0x0) && (*(int *)(n + 0x90) == 10)) {
    plVar1 = *(long **)(n + 0xf0);
    for (plVar4 = *(long **)(n + 0xe8); plVar4 != plVar1; plVar4 = plVar4 + 1) {
      if (*(MemoryMapT **)(*plVar4 + 0x10) != (MemoryMapT *)0x0) {
        bVar3 = mergeMaps(mm,*(MemoryMapT **)(*plVar4 + 0x10),overwritten);
        bVar2 = (bool)(bVar2 | bVar3);
      }
    }
  }
  if ((n != (PSNode *)0x0) && (*(int *)(n + 0x90) == 0xb)) {
    plVar1 = *(long **)(n + 0x110);
    for (plVar4 = *(long **)(n + 0x108); plVar4 != plVar1; plVar4 = plVar4 + 1) {
      if (*(MemoryMapT **)(*plVar4 + 0x10) != (MemoryMapT *)0x0) {
        bVar3 = mergeMaps(mm,*(MemoryMapT **)(*plVar4 + 0x10),overwritten);
        bVar2 = (bool)(bVar2 | bVar3);
      }
    }
  }
  return bVar2;
}

Assistant:

bool afterProcessed(PSNode *n) override {
        bool changed = false;
        PointsToSetT *overwritten = nullptr;

        MemoryMapT *mm = n->getData<MemoryMapT>();
        // we must have the memory map, we created it
        // in the beforeProcessed method
        assert(mm && "Do not have memory map");

        // every store that stores to a memory allocated
        // not in a loop is a strong update
        // FIXME: memcpy can be strong update too
        if (n->getType() == PSNodeType::STORE) {
            if (!pointsToAllocationInLoop(n->getOperand(1)))
                overwritten = &n->getOperand(1)->pointsTo;
        }

        // merge information from predecessors if there's
        // more of them (if there's just one predecessor
        // and this is not a store, the memory map couldn't
        // change, so we don't have to do that)
        if (needsMerge(n)) {
            for (PSNode *p : n->predecessors()) {
                if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                    // merge pm to mm (but only if pm was already created)
                    changed |= mergeMaps(mm, pm, overwritten);
                }
            }

            // interprocedural stuff - merge information from calls
            if (auto *CR = PSNodeCallRet::get(n)) {
                for (auto *p : CR->getReturns()) {
                    if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                        // merge pm to mm (but only if pm was already created)
                        changed |= mergeMaps(mm, pm, overwritten);
                    }
                }
            }
            if (auto *E = PSNodeEntry::get(n)) {
                for (auto *p : E->getCallers()) {
                    if (MemoryMapT *pm = p->getData<MemoryMapT>()) {
                        // merge pm to mm (but only if pm was already created)
                        changed |= mergeMaps(mm, pm, overwritten);
                    }
                }
            }
        }

        return changed;
    }